

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void mocker::ir::printModule(Module *module,ostream *out)

{
  size_type sVar1;
  long lVar2;
  ostream *poVar3;
  Module *pMVar4;
  long lVar5;
  __node_base *p_Var6;
  string str;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pMVar4 = module;
  while (pMVar4 = (Module *)
                  (pMVar4->globalVars).
                  super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                  _M_impl._M_node.super__List_node_base._M_next, pMVar4 != module) {
    std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &(pMVar4->globalVars).
                         super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>
                         ._M_impl._M_node._M_size,":");
    sVar1 = (pMVar4->funcs)._M_h._M_element_count;
    lVar2 = *(long *)&(pMVar4->funcs)._M_h._M_rehash_policy;
    for (lVar5 = 0; lVar2 != lVar5; lVar5 = lVar5 + 1) {
      std::__cxx11::to_string(&local_90,(int)*(char *)(sVar1 + lVar5));
      std::operator+(&local_70," ",&local_90);
      std::operator+(&local_50,&local_70,",");
      std::__cxx11::string::append((string *)&str);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if (str._M_dataplus._M_p[str._M_string_length - 1] == ',') {
      std::__cxx11::string::pop_back();
    }
    poVar3 = std::operator<<(out,(string *)&str);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&str);
  }
  std::endl<char,std::char_traits<char>>(out);
  p_Var6 = &(module->funcs)._M_h._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    printFunc((FunctionModule *)(p_Var6 + 5),out);
    std::endl<char,std::char_traits<char>>(out);
  }
  return;
}

Assistant:

void printModule(const Module &module, std::ostream &out) {
  for (auto &var : module.getGlobalVars()) {
    std::string str = var.getLabel() + ":";
    for (auto &ch : var.getData())
      str += " " + std::to_string(ch) + ",";
    if (str.back() == ',')
      str.pop_back();
    out << str << '\n';
  }
  out << std::endl;

  for (auto &kv : module.getFuncs()) {
    printFunc(kv.second, out);
    out << std::endl;
  }
}